

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_buildSeqStore(ZSTD_CCtx *zc,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  BYTE **ppBVar1;
  U32 UVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  seqStore_t *seqStore;
  ZSTD_blockCompressor p_Var16;
  uint uVar17;
  long lVar18;
  size_t sVar19;
  uint uVar20;
  ZSTD_dictMode_e dictMode;
  rawSeqStore_t ldmSeqStore;
  undefined4 in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff74;
  undefined4 uStack_68;
  rawSeqStore_t local_58;
  
  if (0x20000 < srcSize) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3307,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  uVar5 = (zc->appliedParams).cParams.hashLog;
  uVar6 = (zc->appliedParams).cParams.searchLog;
  cParams1.chainLog = uVar6;
  cParams1.windowLog = uVar5;
  uVar7 = (zc->appliedParams).cParams.minMatch;
  uVar8 = (zc->appliedParams).cParams.targetLength;
  uVar9 = (zc->appliedParams).cParams.strategy;
  cParams1.minMatch = uVar9;
  cParams1.searchLog = uVar8;
  uVar10 = (zc->blockState).matchState.cParams.windowLog;
  uVar11 = (zc->blockState).matchState.cParams.hashLog;
  uVar12 = (zc->blockState).matchState.cParams.searchLog;
  cParams2.chainLog = uVar12;
  cParams2.windowLog = uVar11;
  uVar13 = (zc->blockState).matchState.cParams.minMatch;
  uVar14 = (zc->blockState).matchState.cParams.targetLength;
  uVar15 = (zc->blockState).matchState.cParams.strategy;
  cParams2.minMatch = uVar15;
  cParams2.searchLog = uVar14;
  cParams1.hashLog = uVar7;
  cParams1.targetLength = in_stack_ffffffffffffff54;
  cParams1.strategy = uVar10;
  cParams2.hashLog = uVar13;
  cParams2._20_8_ = in_stack_ffffffffffffff74;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
    sVar19 = 1;
  }
  else {
    (zc->seqStore).lit = (zc->seqStore).litStart;
    (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
    (zc->seqStore).longLengthID = 0;
    pZVar3 = (zc->blockState).prevCBlock;
    (zc->blockState).matchState.opt.symbolCosts = &pZVar3->entropy;
    (zc->blockState).matchState.opt.literalCompressionMode =
         (zc->appliedParams).literalCompressionMode;
    if (((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0) &&
       ((zc->blockState).matchState.loadedDictEnd != (zc->blockState).matchState.window.dictLimit))
    {
      __assert_fail("ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3316,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    lVar18 = (long)src - (long)(zc->blockState).matchState.window.base;
    if (0xfffffffe < lVar18) {
      __assert_fail("istart - base < (ptrdiff_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x331c,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    UVar2 = (zc->blockState).matchState.nextToUpdate;
    uVar17 = (uint)lVar18;
    if (UVar2 + 0x180 < uVar17) {
      uVar20 = (uVar17 - UVar2) - 0x180;
      if (0xbf < uVar20) {
        uVar20 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar17 - uVar20;
    }
    dictMode = ZSTD_extDict;
    if ((zc->blockState).matchState.window.dictLimit <= (zc->blockState).matchState.window.lowLimit)
    {
      dictMode = (uint)((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
    }
    ms = &(zc->blockState).matchState;
    seqStore = &zc->seqStore;
    pZVar4 = (zc->blockState).nextCBlock;
    lVar18 = 0;
    do {
      pZVar4->rep[lVar18] = pZVar3->rep[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    UVar2 = (zc->appliedParams).ldmParams.enableLdm;
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      if (UVar2 != 0) {
        __assert_fail("!zc->appliedParams.ldmParams.enableLdm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3329,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
      }
      seqStore = (seqStore_t *)
                 ZSTD_ldm_blockCompress
                           (&zc->externSeqStore,ms,seqStore,((zc->blockState).nextCBlock)->rep,src,
                            srcSize);
      if ((zc->externSeqStore).size < (zc->externSeqStore).pos) {
        __assert_fail("zc->externSeqStore.pos <= zc->externSeqStore.size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3330,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
      }
    }
    else if (UVar2 == 0) {
      p_Var16 = ZSTD_selectBlockCompressor((zc->appliedParams).cParams.strategy,dictMode);
      seqStore = (seqStore_t *)
                 (*p_Var16)(ms,seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
    }
    else {
      local_58.pos = 0;
      local_58.size = 0;
      local_58.seq = zc->ldmSequences;
      local_58.capacity = zc->maxNbLdmSequences;
      sVar19 = ZSTD_ldm_generateSequences
                         (&zc->ldmState,&local_58,&(zc->appliedParams).ldmParams,src,srcSize);
      if ((sVar19 < 0xffffffffffffff89) &&
         (seqStore = (seqStore_t *)
                     ZSTD_ldm_blockCompress
                               (&local_58,ms,seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize
                               ), local_58.pos != local_58.size)) {
        __assert_fail("ldmSeqStore.pos == ldmSeqStore.size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3340,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
      }
      if (0xffffffffffffff88 < sVar19) {
        return sVar19;
      }
    }
    memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - (long)seqStore)),(size_t)seqStore);
    ppBVar1 = &(zc->seqStore).lit;
    *ppBVar1 = *ppBVar1 + (long)seqStore;
    sVar19 = 0;
  }
  return sVar19;
}

Assistant:

static size_t ZSTD_buildSeqStore(ZSTD_CCtx* zc, const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_buildSeqStore (srcSize=%zu)", srcSize);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);
    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        return ZSTDbss_noCompress; /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;
    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, dictMode);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }
    return ZSTDbss_compress;
}